

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O1

Module * __thiscall
soul::Program::ProgramImpl::insert(ProgramImpl *this,int index,Module *newModule)

{
  iterator __position;
  value_type local_10;
  
  if (index < 0) {
    __position._M_current =
         (this->modules).
         super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->modules).
        super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<soul::pool_ref<soul::Module>,std::allocator<soul::pool_ref<soul::Module>>>::
      _M_realloc_insert<soul::Module&>
                ((vector<soul::pool_ref<soul::Module>,std::allocator<soul::pool_ref<soul::Module>>>
                  *)&this->modules,__position,newModule);
    }
    else {
      (__position._M_current)->object = newModule;
      (this->modules).
      super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  else {
    local_10.object = newModule;
    std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::
    _M_insert_rval(&this->modules,
                   (this->modules).
                   super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (uint)index,&local_10);
  }
  return newModule;
}

Assistant:

Module& insert (int index, Module& newModule)
    {
        if (index < 0)
            modules.emplace_back (newModule);
        else
            modules.insert (modules.begin() + index, newModule);

        return newModule;
    }